

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

_Bool should_prune_chroma_smooth_pred_based_on_source_variance
                (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize)

{
  int iVar1;
  undefined1 in_DL;
  MACROBLOCKD *in_RSI;
  AV1_COMP *in_RDI;
  uint variance;
  int i;
  uint in_stack_ffffffffffffffdc;
  BLOCK_SIZE bsize_00;
  int plane;
  int iVar2;
  undefined3 in_stack_ffffffffffffffe4;
  undefined4 uVar3;
  _Bool local_1;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffe4);
  if (((in_RDI->sf).intra_sf.prune_smooth_intra_mode_for_chroma & 1U) == 0) {
    local_1 = false;
  }
  else {
    plane = 1;
    while( true ) {
      bsize_00 = (BLOCK_SIZE)(in_stack_ffffffffffffffdc >> 0x18);
      iVar2 = plane;
      iVar1 = av1_num_planes(&in_RDI->common);
      if (iVar1 <= plane) break;
      in_stack_ffffffffffffffdc =
           av1_get_perpixel_variance_facade
                     (in_RDI,in_RSI,(buf_2d *)CONCAT44(uVar3,iVar2),bsize_00,plane);
      if (0x13 < in_stack_ffffffffffffffdc) {
        return false;
      }
      plane = iVar2 + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool should_prune_chroma_smooth_pred_based_on_source_variance(
    const AV1_COMP *cpi, const MACROBLOCK *x, BLOCK_SIZE bsize) {
  if (!cpi->sf.intra_sf.prune_smooth_intra_mode_for_chroma) return false;

  // If the source variance of both chroma planes is less than 20 (empirically
  // derived), prune UV_SMOOTH_PRED.
  for (int i = AOM_PLANE_U; i < av1_num_planes(&cpi->common); i++) {
    const unsigned int variance = av1_get_perpixel_variance_facade(
        cpi, &x->e_mbd, &x->plane[i].src, bsize, i);
    if (variance >= 20) return false;
  }
  return true;
}